

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::netstd_type_usings_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this)

{
  bool bVar1;
  allocator local_39;
  undefined1 local_38 [8];
  string namespaces;
  t_netstd_generator *this_local;
  
  namespaces.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_38,
             "using System;\nusing System.Collections;\nusing System.Collections.Generic;\nusing System.Text;\nusing System.IO;\nusing System.Linq;\nusing System.Threading;\nusing System.Threading.Tasks;\nusing Microsoft.Extensions.Logging;\nusing Thrift;\nusing Thrift.Collections;\n"
             ,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = is_wcf_enabled(this);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)local_38,"using System.ServiceModel;\n");
    std::__cxx11::string::operator+=((string *)local_38,"using System.Runtime.Serialization;\n");
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::netstd_type_usings() const
{
    string namespaces =
        "using System;\n"
        "using System.Collections;\n"
        "using System.Collections.Generic;\n"
        "using System.Text;\n"
        "using System.IO;\n"
        "using System.Linq;\n"
        "using System.Threading;\n"
        "using System.Threading.Tasks;\n"
        "using Microsoft.Extensions.Logging;\n"
        "using Thrift;\n"
        "using Thrift.Collections;\n";

    if (is_wcf_enabled())
    {
        namespaces += "using System.ServiceModel;\n";
        namespaces += "using System.Runtime.Serialization;\n";
    }

    return namespaces + endl;
}